

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glesv1_cm_gears.c
# Opt level: O3

void glesv1_cm_gears_term(gears_t_conflict *gears)

{
  GLubyte *__s;
  
  if (gears != (gears_t_conflict *)0x0) {
    if (gears->gear[2] != (gear_conflict *)0x0) {
      delete_gear(gears,2);
    }
    if (gears->gear[1] != (gear_conflict *)0x0) {
      delete_gear(gears,1);
    }
    if (gears->gear[0] != (gear_conflict *)0x0) {
      delete_gear(gears,0);
    }
    __s = (*gears->glGetString)(0x1f02);
    puts((char *)__s);
    if (gears->lib_handle != (void *)0x0) {
      dlclose();
    }
    free(gears);
    return;
  }
  return;
}

Assistant:

static void glesv1_cm_gears_term(gears_t *gears)
{
  if (!gears) {
    return;
  }

  if (gears->gear[GEAR2]) {
    delete_gear(gears, GEAR2);
  }
  if (gears->gear[GEAR1]) {
    delete_gear(gears, GEAR1);
  }
  if (gears->gear[GEAR0]) {
    delete_gear(gears, GEAR0);
  }

  printf("%s\n", gears->glGetString(GL_VERSION));

  if (gears->lib_handle) {
    dlclose(gears->lib_handle);
  }

  free(gears);
}